

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O2

void Ioa_WriteAigerEncodeStr(Vec_Str_t *vStr,uint x)

{
  while( true ) {
    if (x < 0x80) break;
    Vec_StrPush(vStr,(byte)x | 0x80);
    x = x >> 7;
  }
  Vec_StrPush(vStr,(byte)x);
  return;
}

Assistant:

void Ioa_WriteAigerEncodeStr( Vec_Str_t * vStr, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
//        putc (ch, file);
//        pBuffer[Pos++] = ch;
        Vec_StrPush( vStr, ch );
        x >>= 7;
    }
    ch = x;
//    putc (ch, file);
//    pBuffer[Pos++] = ch;
    Vec_StrPush( vStr, ch );
}